

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<15,_11,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  bool bVar5;
  undefined4 uVar6;
  Type in1;
  Type in0;
  undefined8 uStack_a0;
  float local_94 [3];
  Matrix<float,_2,_4> local_88;
  Matrix<float,_2,_4> local_68;
  int local_48 [6];
  Matrix<float,_2,_4> local_30;
  
  pfVar1 = (float *)&local_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar4) {
          uVar6 = 0;
        }
        pfVar1[lVar4 * 2] = (float)uVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      pfVar1 = pfVar1 + 1;
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    local_68.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_68.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_68.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    local_68.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    local_68.m_data.m_data[2].m_data[0] = 0.0;
    local_68.m_data.m_data[2].m_data[1] = 0.0;
    local_68.m_data.m_data[3].m_data[0] = 0.0;
    local_68.m_data.m_data[3].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[0] = 0.0;
    local_68.m_data.m_data[0].m_data[1] = 0.0;
    local_68.m_data.m_data[1].m_data[0] = 0.0;
    local_68.m_data.m_data[1].m_data[1] = 0.0;
    puVar3 = &s_constInMat4x2;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4 * 2] = (float)puVar3[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar5);
  }
  pfVar1 = (float *)&local_88;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar4) {
          uVar6 = 0;
        }
        pfVar1[lVar4 * 2] = (float)uVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      pfVar1 = pfVar1 + 1;
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    local_88.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_88.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_88.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    local_88.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    local_88.m_data.m_data[2].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[1] = 0.0;
    local_88.m_data.m_data[3].m_data[0] = 0.0;
    local_88.m_data.m_data[3].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    puVar3 = &DAT_01c2e230;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4 * 2] = (float)puVar3[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar5);
  }
  uStack_a0 = 0x10c7b60;
  tcu::operator+(&local_30,&local_68,&local_88);
  local_94[0] = local_30.m_data.m_data[0].m_data[0] + local_30.m_data.m_data[0].m_data[1] +
                local_30.m_data.m_data[3].m_data[0];
  local_94[1] = local_30.m_data.m_data[1].m_data[0] + local_30.m_data.m_data[1].m_data[1] +
                local_30.m_data.m_data[3].m_data[1];
  local_94[2] = local_30.m_data.m_data[2].m_data[0] + local_30.m_data.m_data[2].m_data[1];
  local_48[2] = 0;
  local_48[3] = 1;
  local_48[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_48[lVar2]] = *(float *)((long)&uStack_a0 + lVar2 * 4 + 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 + in1);
	}